

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

path * __thiscall ghc::filesystem::path::root_name(path *__return_storage_ptr__,path *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  int iVar3;
  long lVar4;
  _Alloc_hider local_38;
  size_type local_30;
  char local_28;
  undefined7 uStack_27;
  undefined8 uStack_20;
  
  if (((((this->_path)._M_string_length < 3) ||
       (pcVar2 = (this->_path)._M_dataplus._M_p, *pcVar2 != '/')) || (pcVar2[1] != '/')) ||
     ((pcVar2[2] == 0x2f || (iVar3 = isprint((int)pcVar2[2]), iVar3 == 0)))) {
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    (__return_storage_ptr__->_path)._M_string_length = 0;
    (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  lVar4 = std::__cxx11::string::find_first_of((char *)this,0x18f74d,3);
  if (lVar4 == -1) {
    path<std::__cxx11::string,ghc::filesystem::path>
              (__return_storage_ptr__,&this->_path,auto_format);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::substr((ulong)&local_38,(ulong)this);
  paVar1 = &(__return_storage_ptr__->_path).field_2;
  (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)paVar1;
  if (local_38._M_p == &local_28) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_27,local_28);
    *(undefined8 *)((long)&(__return_storage_ptr__->_path).field_2 + 8) = uStack_20;
  }
  else {
    (__return_storage_ptr__->_path)._M_dataplus._M_p = local_38._M_p;
    (__return_storage_ptr__->_path).field_2._M_allocated_capacity = CONCAT71(uStack_27,local_28);
  }
  (__return_storage_ptr__->_path)._M_string_length = local_30;
  local_30 = 0;
  local_28 = '\0';
  local_38._M_p = &local_28;
  postprocess_path_with_format(&__return_storage_ptr__->_path,(format)this);
  if (local_38._M_p == &local_28) {
    return __return_storage_ptr__;
  }
  operator_delete(local_38._M_p,CONCAT71(uStack_27,local_28) + 1);
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::root_name() const
{
#ifdef GHC_OS_WINDOWS
    if (_path.length() >= 2 && std::toupper(static_cast<unsigned char>(_path[0])) >= 'A' && std::toupper(static_cast<unsigned char>(_path[0])) <= 'Z' && _path[1] == ':') {
        return path(_path.substr(0, 2));
    }
#endif
    if (_path.length() > 2 && _path[0] == '/' && _path[1] == '/' && _path[2] != '/' && std::isprint(_path[2])) {
        impl_string_type::size_type pos = _path.find_first_of("/\\", 3);
        if (pos == impl_string_type::npos) {
            return path(_path);
        }
        else {
            return path(_path.substr(0, pos));
        }
    }
    return path();
}